

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propagate_comparison.cpp
# Opt level: O3

unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true> __thiscall
duckdb::StatisticsPropagator::PropagateExpression
          (StatisticsPropagator *this,BoundComparisonExpression *expr,
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expr_ptr)

{
  _Tuple_impl<0UL,_duckdb::NodeStatistics_*,_std::default_delete<duckdb::NodeStatistics>_> _Var1;
  undefined8 uVar2;
  FilterPropagateResult FVar3;
  type lstats;
  type rstats;
  _Head_base<0UL,_duckdb::NodeStatistics_*,_false> _Var4;
  _Head_base<0UL,_duckdb::NodeStatistics_*,_false> *in_RCX;
  StatisticsPropagator *this_00;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  *this_01;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  children;
  undefined1 local_178 [16];
  optional_ptr<duckdb::LogicalOperator,_true> local_168;
  element_type *peStack_160;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_158;
  undefined1 local_128 [64];
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  local_e8;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  local_c8;
  Value local_b0;
  Value local_70;
  
  PropagateExpression((StatisticsPropagator *)(local_178 + 8),
                      (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)expr);
  PropagateExpression((StatisticsPropagator *)local_178,
                      (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)expr);
  if ((ClientContext *)local_178._8_8_ == (ClientContext *)0x0 ||
      (Optimizer *)local_178._0_8_ == (Optimizer *)0x0) {
    this->optimizer = (Optimizer *)0x0;
    goto LAB_00c7d912;
  }
  lstats = unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>::
           operator*((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                      *)(local_178 + 8));
  this_00 = (StatisticsPropagator *)local_178;
  rstats = unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>::
           operator*((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                      *)this_00);
  FVar3 = PropagateComparison(this_00,lstats,rstats,
                              *(ExpressionType *)
                               &expr_ptr[1].
                                super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                                ._M_t.
                                super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                                .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl);
  switch(FVar3) {
  case FILTER_ALWAYS_TRUE:
    Value::BOOLEAN((Value *)local_128,true);
    _Var4._M_head_impl = (NodeStatistics *)operator_new(0x98);
    Value::Value((Value *)&local_168,(Value *)local_128);
    BoundConstantExpression::BoundConstantExpression
              ((BoundConstantExpression *)_Var4._M_head_impl,(Value *)&local_168);
    break;
  case FILTER_ALWAYS_FALSE:
    Value::BOOLEAN((Value *)local_128,false);
    _Var4._M_head_impl = (NodeStatistics *)operator_new(0x98);
    Value::Value((Value *)&local_168,(Value *)local_128);
    BoundConstantExpression::BoundConstantExpression
              ((BoundConstantExpression *)_Var4._M_head_impl,(Value *)&local_168);
    break;
  case FILTER_TRUE_OR_NULL:
    local_168.ptr = (LogicalOperator *)0x0;
    peStack_160 = (element_type *)0x0;
    local_158._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                *)&local_168,expr_ptr + 0xb);
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                *)&local_168,expr_ptr + 0xc);
    local_c8.
    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_168.ptr;
    local_c8.
    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)peStack_160;
    local_c8.
    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_158._M_pi;
    local_168.ptr = (LogicalOperator *)0x0;
    peStack_160 = (element_type *)0x0;
    local_158._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    Value::BOOLEAN(&local_70,true);
    ExpressionRewriter::ConstantOrNull((ExpressionRewriter *)local_128,&local_c8,&local_70);
    uVar2 = local_128._0_8_;
    local_128._0_8_ = (_Head_base<0UL,_duckdb::NodeStatistics_*,_false>)0x0;
    _Var4._M_head_impl = in_RCX->_M_head_impl;
    in_RCX->_M_head_impl = (NodeStatistics *)uVar2;
    if (((_Head_base<0UL,_duckdb::NodeStatistics_*,_false>)_Var4._M_head_impl !=
         (_Head_base<0UL,_duckdb::NodeStatistics_*,_false>)0x0) &&
       ((**(code **)(*(long *)_Var4._M_head_impl + 8))(),
       (_Tuple_impl<0UL,_duckdb::NodeStatistics_*,_std::default_delete<duckdb::NodeStatistics>_>)
       local_128._0_8_ != (NodeStatistics *)0x0)) {
      (**(code **)(*(long *)local_128._0_8_ + 8))();
    }
    local_128._0_8_ =
         (tuple<duckdb::NodeStatistics_*,_std::default_delete<duckdb::NodeStatistics>_>)0x0;
    Value::~Value(&local_70);
    this_01 = (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               *)&local_c8;
    goto LAB_00c7d87b;
  case FILTER_FALSE_OR_NULL:
    local_168.ptr = (LogicalOperator *)0x0;
    peStack_160 = (element_type *)0x0;
    local_158._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                *)&local_168,expr_ptr + 0xb);
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                *)&local_168,expr_ptr + 0xc);
    local_e8.
    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_168.ptr;
    local_e8.
    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)peStack_160;
    local_e8.
    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_158._M_pi;
    local_168.ptr = (LogicalOperator *)0x0;
    peStack_160 = (element_type *)0x0;
    local_158._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    Value::BOOLEAN(&local_b0,false);
    ExpressionRewriter::ConstantOrNull((ExpressionRewriter *)local_128,&local_e8,&local_b0);
    uVar2 = local_128._0_8_;
    local_128._0_8_ = (_Head_base<0UL,_duckdb::NodeStatistics_*,_false>)0x0;
    _Var4._M_head_impl = in_RCX->_M_head_impl;
    in_RCX->_M_head_impl = (NodeStatistics *)uVar2;
    if (((_Head_base<0UL,_duckdb::NodeStatistics_*,_false>)_Var4._M_head_impl !=
         (_Head_base<0UL,_duckdb::NodeStatistics_*,_false>)0x0) &&
       ((**(code **)(*(long *)_Var4._M_head_impl + 8))(),
       (_Tuple_impl<0UL,_duckdb::NodeStatistics_*,_std::default_delete<duckdb::NodeStatistics>_>)
       local_128._0_8_ != (NodeStatistics *)0x0)) {
      (**(code **)(*(long *)local_128._0_8_ + 8))();
    }
    local_128._0_8_ =
         (tuple<duckdb::NodeStatistics_*,_std::default_delete<duckdb::NodeStatistics>_>)0x0;
    Value::~Value(&local_b0);
    this_01 = (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               *)&local_e8;
LAB_00c7d87b:
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ::~vector(this_01);
    this->optimizer = (Optimizer *)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               *)&local_168);
    goto LAB_00c7d912;
  default:
    this->optimizer = (Optimizer *)0x0;
    goto LAB_00c7d912;
  }
  Value::~Value((Value *)&local_168);
  _Var1.super__Head_base<0UL,_duckdb::NodeStatistics_*,_false>._M_head_impl =
       (_Head_base<0UL,_duckdb::NodeStatistics_*,_false>)in_RCX->_M_head_impl;
  in_RCX->_M_head_impl = _Var4._M_head_impl;
  if (_Var1.super__Head_base<0UL,_duckdb::NodeStatistics_*,_false>._M_head_impl !=
      (NodeStatistics *)0x0) {
    (**(code **)(*(long *)_Var1.super__Head_base<0UL,_duckdb::NodeStatistics_*,_false>._M_head_impl
                + 8))();
  }
  Value::~Value((Value *)local_128);
  PropagateExpression(this,(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                            *)expr);
LAB_00c7d912:
  if ((Optimizer *)local_178._0_8_ != (Optimizer *)0x0) {
    BaseStatistics::~BaseStatistics((BaseStatistics *)local_178._0_8_);
    operator_delete((void *)local_178._0_8_);
  }
  if ((ClientContext *)local_178._8_8_ != (ClientContext *)0x0) {
    BaseStatistics::~BaseStatistics((BaseStatistics *)local_178._8_8_);
    operator_delete((void *)local_178._8_8_);
  }
  return (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
         (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)this;
}

Assistant:

unique_ptr<BaseStatistics> StatisticsPropagator::PropagateExpression(BoundComparisonExpression &expr,
                                                                     unique_ptr<Expression> &expr_ptr) {
	auto left_stats = PropagateExpression(expr.left);
	auto right_stats = PropagateExpression(expr.right);
	if (!left_stats || !right_stats) {
		return nullptr;
	}
	// propagate the statistics of the comparison operator
	auto propagate_result = PropagateComparison(*left_stats, *right_stats, expr.GetExpressionType());
	switch (propagate_result) {
	case FilterPropagateResult::FILTER_ALWAYS_TRUE:
		expr_ptr = make_uniq<BoundConstantExpression>(Value::BOOLEAN(true));
		return PropagateExpression(expr_ptr);
	case FilterPropagateResult::FILTER_ALWAYS_FALSE:
		expr_ptr = make_uniq<BoundConstantExpression>(Value::BOOLEAN(false));
		return PropagateExpression(expr_ptr);
	case FilterPropagateResult::FILTER_TRUE_OR_NULL: {
		vector<unique_ptr<Expression>> children;
		children.push_back(std::move(expr.left));
		children.push_back(std::move(expr.right));
		expr_ptr = ExpressionRewriter::ConstantOrNull(std::move(children), Value::BOOLEAN(true));
		return nullptr;
	}
	case FilterPropagateResult::FILTER_FALSE_OR_NULL: {
		vector<unique_ptr<Expression>> children;
		children.push_back(std::move(expr.left));
		children.push_back(std::move(expr.right));
		expr_ptr = ExpressionRewriter::ConstantOrNull(std::move(children), Value::BOOLEAN(false));
		return nullptr;
	}
	default:
		// FIXME: we can propagate nulls here, i.e. this expression will have nulls only if left and right has nulls
		return nullptr;
	}
}